

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
          (MultiSampleState *this,MultiSampleState *other)

{
  uint *__last;
  uint *__first;
  reference pvVar1;
  allocator<unsigned_int> local_39;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  ulong local_20;
  size_t sampleMaskArrayLen;
  MultiSampleState *other_local;
  MultiSampleState *this_local;
  
  sampleMaskArrayLen = (size_t)other;
  other_local = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_sampleMask);
  (this->super_VkPipelineMultisampleStateCreateInfo).sType = *(VkStructureType *)sampleMaskArrayLen;
  (this->super_VkPipelineMultisampleStateCreateInfo).pNext = *(void **)(sampleMaskArrayLen + 8);
  (this->super_VkPipelineMultisampleStateCreateInfo).flags =
       *(VkPipelineMultisampleStateCreateFlags *)(sampleMaskArrayLen + 0x10);
  (this->super_VkPipelineMultisampleStateCreateInfo).rasterizationSamples =
       *(VkSampleCountFlagBits *)(sampleMaskArrayLen + 0x14);
  (this->super_VkPipelineMultisampleStateCreateInfo).sampleShadingEnable =
       *(VkBool32 *)(sampleMaskArrayLen + 0x18);
  (this->super_VkPipelineMultisampleStateCreateInfo).minSampleShading =
       *(float *)(sampleMaskArrayLen + 0x1c);
  local_20 = (ulong)*(uint *)(sampleMaskArrayLen + 0x14) + 0x20 >> 5;
  __first = *(uint **)(sampleMaskArrayLen + 0x20);
  __last = __first + local_20;
  std::allocator<unsigned_int>::allocator(&local_39);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_38,__first,__last,&local_39
            );
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->m_sampleMask,&local_38)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_38);
  std::allocator<unsigned_int>::~allocator(&local_39);
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->m_sampleMask,0);
  (this->super_VkPipelineMultisampleStateCreateInfo).pSampleMask = pvVar1;
  return;
}

Assistant:

PipelineCreateInfo::MultiSampleState::MultiSampleState (const MultiSampleState& other)
{
	sType					= other.sType;
	pNext					= other.pNext;
	flags					= other.flags;
	rasterizationSamples	= other.rasterizationSamples;
	sampleShadingEnable		= other.sampleShadingEnable;
	minSampleShading		= other.minSampleShading;

	const size_t sampleMaskArrayLen = (sizeof(vk::VkSampleMask) * 8 + other.rasterizationSamples) / (sizeof(vk::VkSampleMask) * 8);

	m_sampleMask	= std::vector<vk::VkSampleMask>(other.pSampleMask, other.pSampleMask + sampleMaskArrayLen);
	pSampleMask		= &m_sampleMask[0];
}